

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simSupp.c
# Opt level: O3

int Sim_ComputeSuppRound(Sim_Man_t *p,int fUseTargets)

{
  int iVar1;
  int fUseTargets_00;
  long lVar2;
  long lVar3;
  int iVar4;
  timespec ts;
  timespec local_30;
  
  iVar1 = clock_gettime(3,&local_30);
  if (iVar1 < 0) {
    lVar2 = 1;
  }
  else {
    lVar2 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_30.tv_nsec),8);
    lVar2 = ((lVar2 >> 7) - (lVar2 >> 0x3f)) + local_30.tv_sec * -1000000;
  }
  iVar4 = 0;
  Sim_UtilSimulate(p,0);
  iVar1 = clock_gettime(3,&local_30);
  if (iVar1 < 0) {
    lVar3 = -1;
  }
  else {
    lVar3 = local_30.tv_nsec / 1000 + local_30.tv_sec * 1000000;
  }
  p->timeSim = p->timeSim + lVar3 + lVar2;
  lVar2 = (long)p->iInput;
  iVar1 = p->nInputs;
  if (p->iInput < iVar1) {
    iVar4 = 0;
    do {
      fUseTargets_00 = 0;
      if ((fUseTargets == 0) ||
         (fUseTargets_00 = 1, *(int *)((long)p->vSuppTargs->pArray[lVar2] + 4) != 0)) {
        iVar1 = Sim_ComputeSuppRoundNode(p,(int)lVar2,fUseTargets_00);
        iVar4 = iVar4 + iVar1;
        iVar1 = p->nInputs;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < iVar1);
  }
  return iVar4;
}

Assistant:

int Sim_ComputeSuppRound( Sim_Man_t * p, int  fUseTargets )
{
    Vec_Ptr_t * vTargets;
    int i, Counter = 0;
    abctime clk;
    // perform one round of random simulation
clk = Abc_Clock();
    Sim_UtilSimulate( p, 0 );
p->timeSim += Abc_Clock() - clk;
    // iterate through the CIs and detect COs that depend on them
    for ( i = p->iInput; i < p->nInputs; i++ )
    {
        vTargets = (Vec_Ptr_t *)p->vSuppTargs->pArray[i];
        if ( fUseTargets && vTargets->nSize == 0 )
            continue;
        Counter += Sim_ComputeSuppRoundNode( p, i, fUseTargets );
    }
    return Counter;
}